

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

SyntaxTree * __thiscall DL::Parser::gr_tr_unit(Parser *this)

{
  bool bVar1;
  vector<DL::StatementNode*,std::allocator<DL::StatementNode*>> *this_00;
  StatementNode *local_88;
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  this_00 = (vector<DL::StatementNode*,std::allocator<DL::StatementNode*>> *)operator_new(0x18);
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  while( true ) {
    bVar1 = lookahead(this,T_OpenParanthese);
    if (!bVar1) break;
    match((Token *)local_58,this,T_OpenParanthese);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    local_88 = gr_statement(this);
    std::vector<DL::StatementNode*,std::allocator<DL::StatementNode*>>::
    emplace_back<DL::StatementNode*>(this_00,&local_88);
    match((Token *)local_80,this,T_CloseParanthese);
    std::__cxx11::string::~string((string *)(local_80 + 8));
  }
  return (SyntaxTree *)this_00;
}

Assistant:

SyntaxTree* Parser::gr_tr_unit()
{
	SyntaxTree* unit = new SyntaxTree;
	while (lookahead(T_OpenParanthese)) {
		match(T_OpenParanthese);
		unit->Nodes.push_back(gr_statement());
		match(T_CloseParanthese);
	};
	return unit;
}